

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alffplay.cpp
# Opt level: O1

void anon_unknown.dwarf_e23c::AudioState::EventCallback
               (ALenum eventType,ALuint object,ALuint param,ALsizei length,ALchar *message,
               void *userParam)

{
  long lVar1;
  code cVar2;
  undefined1 uVar3;
  int iVar4;
  ostream *poVar5;
  long *plVar6;
  undefined8 uVar7;
  long lVar8;
  char *pcVar9;
  unique_lock<std::mutex> local_50;
  unique_lock<std::mutex> local_40;
  
  if (eventType == 0x19a4) {
    local_50._M_device = (mutex_type *)((long)userParam + 0x148);
    local_50._M_owns = false;
    std::unique_lock<std::mutex>::lock(&local_50);
    local_50._M_owns = true;
    std::unique_lock<std::mutex>::unlock(&local_50);
    std::unique_lock<std::mutex>::~unique_lock(&local_50);
    goto LAB_001099e0;
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"\n---- AL Event on AudioState ",0x1d);
  poVar5 = std::ostream::_M_insert<void_const*>(&std::cout);
  std::__ostream_insert<char,std::char_traits<char>>(poVar5," ----\nEvent: ",0xd);
  if (eventType == 0x19a6) {
    pcVar9 = "Disconnected";
    lVar8 = 0xc;
LAB_001097e8:
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,pcVar9,lVar8);
  }
  else {
    if (eventType == 0x19a5) {
      pcVar9 = "Source state changed";
      lVar8 = 0x14;
      goto LAB_001097e8;
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"0x",2);
    lVar8 = std::cout;
    *(uint *)(av_frame_unref + *(long *)(std::cout + -0x18)) =
         *(uint *)(av_frame_unref + *(long *)(std::cout + -0x18)) & 0xffffffb5 | 8;
    *(undefined8 *)(avio_open2 + *(long *)(lVar8 + -0x18)) = 4;
    lVar8 = *(long *)(lVar8 + -0x18);
    if ((&DAT_001101b9)[lVar8] == '\0') {
      cVar2 = (code)std::ios::widen((char)lVar8 + -0x28);
      __cxa_atexit[lVar8] = cVar2;
      (&DAT_001101b9)[lVar8] = 1;
    }
    __cxa_atexit[lVar8] = (code)0x30;
    plVar6 = (long *)std::ostream::operator<<((ostream *)&std::cout,eventType);
    lVar1 = *plVar6;
    *(uint *)((long)plVar6 + *(long *)(lVar1 + -0x18) + 0x18) =
         *(uint *)((long)plVar6 + *(long *)(lVar1 + -0x18) + 0x18) & 0xffffffb5 | 2;
    *(undefined8 *)((long)plVar6 + *(long *)(lVar1 + -0x18) + 0x10) = 0;
    lVar8 = (long)plVar6 + *(long *)(lVar1 + -0x18);
    if (*(char *)((long)plVar6 + *(long *)(lVar1 + -0x18) + 0xe1) == '\0') {
      uVar3 = std::ios::widen((char)lVar8);
      *(undefined1 *)(lVar8 + 0xe0) = uVar3;
      *(undefined1 *)(lVar8 + 0xe1) = 1;
    }
    *(undefined1 *)(lVar8 + 0xe0) = 0x20;
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\nObject ID: ",0xc);
  poVar5 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
  std::__ostream_insert<char,std::char_traits<char>>(poVar5,"\nParameter: ",0xc);
  poVar5 = std::ostream::_M_insert<unsigned_long>((ulong)poVar5);
  std::__ostream_insert<char,std::char_traits<char>>(poVar5,"\nMessage: ",10);
  local_50._M_device = (mutex_type *)&local_40;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_50,message,message + (uint)length);
  poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar5,(char *)local_50._M_device,CONCAT71(local_50._9_7_,local_50._M_owns));
  std::__ostream_insert<char,std::char_traits<char>>(poVar5,"\n----",5);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar5 + -0x18) + (char)poVar5);
  std::ostream::put((char)poVar5);
  std::ostream::flush();
  if ((unique_lock<std::mutex> *)local_50._M_device != &local_40) {
    operator_delete(local_50._M_device,
                    (ulong)((long)&((local_40._M_device)->super___mutex_base)._M_mutex + 1));
  }
  if (eventType != 0x19a6) {
    return;
  }
  iVar4 = pthread_mutex_lock((pthread_mutex_t *)((long)userParam + 0x148));
  if (iVar4 != 0) {
    uVar7 = std::__throw_system_error(iVar4);
    _Unwind_Resume(uVar7);
  }
  *(undefined1 *)((long)userParam + 0x1a0) = 0;
  pthread_mutex_unlock((pthread_mutex_t *)((long)userParam + 0x148));
LAB_001099e0:
  std::condition_variable::notify_one();
  return;
}

Assistant:

void AL_APIENTRY AudioState::EventCallback(ALenum eventType, ALuint object, ALuint param,
    ALsizei length, const ALchar *message, void *userParam)
{
    auto self = static_cast<AudioState*>(userParam);

    if(eventType == AL_EVENT_TYPE_BUFFER_COMPLETED_SOFT)
    {
        /* Temporarily lock the source mutex to ensure it's not between
         * checking the processed count and going to sleep.
         */
        std::unique_lock<std::mutex>{self->mSrcMutex}.unlock();
        self->mSrcCond.notify_one();
        return;
    }

    std::cout<< "\n---- AL Event on AudioState "<<self<<" ----\nEvent: ";
    switch(eventType)
    {
    case AL_EVENT_TYPE_BUFFER_COMPLETED_SOFT: std::cout<< "Buffer completed"; break;
    case AL_EVENT_TYPE_SOURCE_STATE_CHANGED_SOFT: std::cout<< "Source state changed"; break;
    case AL_EVENT_TYPE_DISCONNECTED_SOFT: std::cout<< "Disconnected"; break;
    default:
        std::cout<< "0x"<<std::hex<<std::setw(4)<<std::setfill('0')<<eventType<<std::dec<<
            std::setw(0)<<std::setfill(' '); break;
    }
    std::cout<< "\n"
        "Object ID: "<<object<<"\n"
        "Parameter: "<<param<<"\n"
        "Message: "<<std::string{message, static_cast<ALuint>(length)}<<"\n----"<<
        std::endl;

    if(eventType == AL_EVENT_TYPE_DISCONNECTED_SOFT)
    {
        {
            std::lock_guard<std::mutex> lock{self->mSrcMutex};
            self->mConnected.clear(std::memory_order_release);
        }
        self->mSrcCond.notify_one();
    }
}